

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O3

void __thiscall Fl_Scroll::recalc_scrollbars(Fl_Scroll *this,ScrollInfo *si)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  Fl_Widget *pFVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Fl_Widget **ppFVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  iVar13 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar7 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).x = iVar7 + iVar13;
  iVar13 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar7 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).y = iVar7 + iVar13;
  iVar13 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar7 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).w = iVar13 - iVar7;
  iVar13 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar7 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).h = iVar13 - iVar7;
  uVar1 = (si->innerbox).x;
  uVar2 = (si->innerbox).y;
  (si->child).l = uVar1;
  (si->child).r = uVar1;
  (si->child).t = uVar2;
  (si->child).b = uVar2;
  ppFVar9 = Fl_Group::array(&this->super_Fl_Group);
  iVar13 = (this->super_Fl_Group).children_;
  if (iVar13 != 0) {
    iVar7 = (si->child).t;
    iVar14 = (si->child).b;
    iVar16 = (si->child).l;
    iVar11 = (si->child).r;
    bVar6 = true;
    lVar10 = 0;
    do {
      pFVar5 = ppFVar9[lVar10];
      if ((Fl_Scrollbar *)pFVar5 != &this->hscrollbar && (Fl_Scrollbar *)pFVar5 != &this->scrollbar)
      {
        iVar15 = pFVar5->x_;
        if (bVar6) {
          (si->child).l = iVar15;
          iVar11 = pFVar5->w_ + iVar15;
          (si->child).r = iVar11;
          iVar7 = pFVar5->y_;
          iVar14 = pFVar5->h_ + iVar7;
          (si->child).b = iVar14;
          (si->child).t = iVar7;
          bVar6 = false;
          iVar16 = iVar15;
        }
        else {
          if (iVar15 < iVar16) {
            (si->child).l = iVar15;
            iVar16 = iVar15;
          }
          iVar12 = pFVar5->y_;
          if (iVar12 < iVar7) {
            (si->child).t = iVar12;
            iVar7 = iVar12;
          }
          iVar15 = iVar15 + pFVar5->w_;
          if (iVar11 < iVar15) {
            (si->child).r = iVar15;
            iVar11 = iVar15;
          }
          iVar12 = iVar12 + pFVar5->h_;
          bVar6 = false;
          if (iVar14 < iVar12) {
            (si->child).b = iVar12;
            iVar14 = iVar12;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar13 != (int)lVar10);
  }
  iVar13 = (si->innerbox).x;
  iVar7 = (si->innerbox).y;
  iVar14 = (si->innerbox).w;
  iVar16 = (si->innerbox).h;
  uVar8 = this->scrollbar_size_;
  if (uVar8 == 0) {
    uVar8 = Fl::scrollbar_size();
  }
  si->scrollsize = uVar8;
  si->hneeded = 0;
  si->vneeded = 0;
  bVar3 = (this->super_Fl_Group).super_Fl_Widget.type_;
  bVar6 = true;
  if (((bVar3 & 2) != 0) &&
     ((((bVar3 & 4) != 0 || ((si->child).t < iVar7)) || (iVar16 + iVar7 < (si->child).b)))) {
    si->vneeded = 1;
    iVar14 = iVar14 - uVar8;
    iVar13 = iVar13 + ((int)((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.
                             label_.align_ << 0x1d) >> 0x1f & uVar8);
    bVar6 = false;
  }
  if (((bVar3 & 1) != 0) &&
     ((((bVar3 & 4) != 0 || ((si->child).l < iVar13)) || (iVar13 + iVar14 < (si->child).r)))) {
    si->hneeded = 1;
    iVar16 = iVar16 - uVar8;
    uVar4 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
    iVar7 = (-(uVar4 & 1) & uVar8) + iVar7;
    if (((bVar6) && ((bVar3 & 2) != 0)) &&
       (((bVar3 & 4) != 0 || (((si->child).t < iVar7 || (iVar7 + iVar16 < (si->child).b)))))) {
      si->vneeded = 1;
      iVar14 = iVar14 - uVar8;
      iVar13 = iVar13 + ((int)(uVar4 << 0x1d) >> 0x1f & uVar8);
    }
  }
  (si->innerchild).x = iVar13;
  (si->innerchild).y = iVar7;
  (si->innerchild).w = iVar14;
  (si->innerchild).h = iVar16;
  (si->hscroll).x = iVar13;
  uVar4 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
  iVar11 = (si->innerbox).y;
  iVar15 = (si->innerbox).x;
  iVar12 = (iVar11 - uVar8) + (si->innerbox).h;
  if ((uVar4 & 1) != 0) {
    iVar12 = iVar11;
  }
  (si->hscroll).y = iVar12;
  (si->hscroll).w = iVar14;
  (si->hscroll).h = uVar8;
  iVar11 = (iVar15 - uVar8) + (si->innerbox).w;
  if ((uVar4 & 4) != 0) {
    iVar11 = iVar15;
  }
  (si->vscroll).x = iVar11;
  (si->vscroll).y = iVar7;
  (si->vscroll).w = uVar8;
  (si->vscroll).h = iVar16;
  iVar11 = (si->child).l;
  (si->hscroll).pos = iVar13 - iVar11;
  (si->hscroll).size = iVar14;
  (si->hscroll).first = 0;
  iVar14 = (si->child).r - iVar11;
  iVar13 = iVar13 - iVar11;
  (si->hscroll).total = iVar14;
  if (iVar13 < 0) {
    (si->hscroll).total = iVar14 - iVar13;
    (si->hscroll).first = iVar13;
  }
  iVar13 = (si->child).t;
  iVar14 = (si->child).b - iVar13;
  iVar7 = iVar7 - iVar13;
  (si->vscroll).pos = iVar7;
  (si->vscroll).size = iVar16;
  (si->vscroll).first = 0;
  (si->vscroll).total = iVar14;
  if (iVar7 < 0) {
    (si->vscroll).total = iVar14 - iVar7;
    (si->vscroll).first = iVar7;
  }
  return;
}

Assistant:

void Fl_Scroll::recalc_scrollbars(ScrollInfo &si) {

  // inner box of widget (excluding scrollbars)
  si.innerbox.x = x()+Fl::box_dx(box());
  si.innerbox.y = y()+Fl::box_dy(box());
  si.innerbox.w = w()-Fl::box_dw(box());
  si.innerbox.h = h()-Fl::box_dh(box());

  // accumulate a bounding box for all the children
  si.child.l = si.innerbox.x;
  si.child.r = si.innerbox.x;
  si.child.b = si.innerbox.y;
  si.child.t = si.innerbox.y;
  int first = 1;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if ( o==&scrollbar || o==&hscrollbar ) continue;
    if ( first ) {
        first = 0;
	si.child.l = o->x();
	si.child.r = o->x()+o->w();
	si.child.b = o->y()+o->h();
	si.child.t = o->y();
    } else {
	if (o->x() < si.child.l) si.child.l = o->x();
	if (o->y() < si.child.t) si.child.t = o->y();
	if (o->x()+o->w() > si.child.r) si.child.r = o->x()+o->w();
	if (o->y()+o->h() > si.child.b) si.child.b = o->y()+o->h();
    }
  }

  // Turn the scrollbars on and off as necessary.
  // See if children would fit if we had no scrollbars...
  {
    int X = si.innerbox.x;
    int Y = si.innerbox.y;
    int W = si.innerbox.w;
    int H = si.innerbox.h;

    si.scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    si.vneeded = 0;
    si.hneeded = 0;
    if (type() & VERTICAL) {
      if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	si.vneeded = 1;
	W -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
      }
    }
    if (type() & HORIZONTAL) {
      if ((type() & ALWAYS_ON) || si.child.l < X || si.child.r > X+W) {
	si.hneeded = 1;
	H -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_TOP) Y += si.scrollsize;
	// recheck vertical since we added a horizontal scrollbar
	if (!si.vneeded && (type() & VERTICAL)) {
	  if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	    si.vneeded = 1;
	    W -= si.scrollsize;
	    if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
	  }
	}
      }
    }
    si.innerchild.x = X;
    si.innerchild.y = Y;
    si.innerchild.w = W;
    si.innerchild.h = H;
  }

  // calculate hor scrollbar position
  si.hscroll.x = si.innerchild.x;
  si.hscroll.y = (scrollbar.align() & FL_ALIGN_TOP)
		     ? si.innerbox.y
		     : si.innerbox.y + si.innerbox.h - si.scrollsize;
  si.hscroll.w = si.innerchild.w;
  si.hscroll.h = si.scrollsize;

  // calculate ver scrollbar position
  si.vscroll.x = (scrollbar.align() & FL_ALIGN_LEFT)
                     ? si.innerbox.x
		     : si.innerbox.x + si.innerbox.w - si.scrollsize;
  si.vscroll.y = si.innerchild.y;
  si.vscroll.w = si.scrollsize;
  si.vscroll.h = si.innerchild.h;

  // calculate h/v scrollbar values (pos/size/first/total)
  si.hscroll.pos = si.innerchild.x - si.child.l;
  si.hscroll.size = si.innerchild.w;
  si.hscroll.first = 0;
  si.hscroll.total = si.child.r - si.child.l;
  if ( si.hscroll.pos < 0 ) { si.hscroll.total += (-si.hscroll.pos); si.hscroll.first = si.hscroll.pos; }

  si.vscroll.pos = si.innerchild.y - si.child.t;
  si.vscroll.size = si.innerchild.h;
  si.vscroll.first = 0;
  si.vscroll.total = si.child.b - si.child.t;
  if ( si.vscroll.pos < 0 ) { si.vscroll.total += (-si.vscroll.pos); si.vscroll.first = si.vscroll.pos; }

//  printf("DEBUG --- ScrollInfo ---\n");
//  printf("DEBUG        scrollsize: %d\n", si.scrollsize);
//  printf("DEBUG  hneeded, vneeded: %d %d\n", si.hneeded, si.vneeded);
//  printf("DEBUG     innerbox.x, si.innerbox.y, si.innerbox.w,si.innerbox.h);
//  printf("DEBUG   innerchild.xywh: %d %d %d %d\n", si.innerchild.x, si.innerchild.y, si.innerchild.w, si.innerchild.h);
//  printf("DEBUG        child lrbt: %d %d %d %d\n", si.child.l, si.child.r, si.child.b, si.child.t);
//  printf("DEBUG      hscroll xywh: %d %d %d %d\n", si.hscroll.x, si.hscroll.y, si.hscroll.w, si.hscroll.h);
//  printf("DEBUG      vscroll xywh: %d %d %d %d\n", si.vscroll.x, si.vscroll.y, si.vscroll.w, si.vscroll.h);
//  printf("DEBUG  horz scroll vals: %d %d %d %d\n", si.hscroll.pos, si.hscroll.size, si.hscroll.first, si.hscroll.total);
//  printf("DEBUG  vert scroll vals: %d %d %d %d\n", si.vscroll.pos, si.vscroll.size, si.vscroll.first, si.vscroll.total);
//  printf("DEBUG \n");
}